

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O1

void cpsm::
     str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,unsigned_long args_2,
               char *args_3,unsigned_long args_4)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  char *local_38;
  
  poVar1 = (ostream *)(ss + 0x10);
  __s = *x;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  local_38 = args_1;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long>
            (ss,&local_38,args_2,args_3,args_4);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}